

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpreadsheetMode.cpp
# Opt level: O0

void __thiscall KDReports::Test::testWithHeaders(Test *this)

{
  int iVar1;
  QFont *pQVar2;
  AutoTableElement *pAVar3;
  AutoTableElement local_108 [8];
  AutoTableElement tableElement;
  QString local_e8;
  TextElement local_d0 [24];
  QLatin1String local_b8;
  QString local_a8;
  QFont local_90 [20];
  QFlags<KDReports::HeaderLocation> local_7c;
  QFont *local_78;
  Header *header;
  QString local_60;
  QFont local_48 [32];
  Report local_28 [8];
  Report report;
  Test *this_local;
  
  fillModel(this,4,0x14,false);
  KDReports::Report::Report(local_28,(QObject *)0x0);
  KDReports::Report::setReportMode((ReportMode)local_28);
  QLatin1String::QLatin1String((QLatin1String *)&header,"Noto Sans");
  QString::QString(&local_60,_header);
  QFont::QFont(local_48,&local_60,8,-1,false);
  KDReports::Report::setDefaultFont((QFont *)local_28);
  QFont::~QFont(local_48);
  QString::~QString(&local_60);
  QFlags<KDReports::HeaderLocation>::QFlags(&local_7c,FirstPage);
  pQVar2 = (QFont *)KDReports::Report::header((QFlags_conflict *)local_28);
  local_78 = pQVar2;
  QLatin1String::QLatin1String(&local_b8,"courier");
  QString::QString(&local_a8,local_b8);
  QFont::QFont(local_90,&local_a8,0x28,-1,false);
  KDReports::Header::setDefaultFont(pQVar2);
  QFont::~QFont(local_90);
  QString::~QString(&local_a8);
  pQVar2 = local_78;
  QString::QString(&local_e8,"This is the page header.\nIt\'s big.\nVery\nbig.\nHuge.");
  KDReports::TextElement::TextElement(local_d0,&local_e8);
  KDReports::Header::addElement(pQVar2,local_d0,1);
  KDReports::TextElement::~TextElement(local_d0);
  QString::~QString(&local_e8);
  KDReports::AutoTableElement::AutoTableElement(local_108,(QAbstractItemModel *)&this->m_model);
  KDReports::AutoTableElement::setVerticalHeaderVisible(SUB81(local_108,0));
  KDReports::AbstractTableElement::setPadding(3.0);
  pAVar3 = (AutoTableElement *)KDReports::Report::mainTable();
  KDReports::MainTable::setAutoTableElement(pAVar3);
  iVar1 = KDReports::Report::numberOfPages();
  QTest::qCompare(iVar1,2,"report.numberOfPages()","2",
                  "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                  ,0x1c4);
  KDReports::AutoTableElement::~AutoTableElement(local_108);
  KDReports::Report::~Report(local_28);
  return;
}

Assistant:

void testWithHeaders()
    {
        fillModel(4, 20);
        Report report;
        report.setReportMode(Report::SpreadSheet);
        report.setDefaultFont(QFont(QLatin1String(s_fontName), 8));
        // A page header with a huge font
        KDReports::Header &header = report.header(KDReports::FirstPage);
        header.setDefaultFont(QFont(QLatin1String("courier"), 40));
        header.addElement(KDReports::TextElement("This is the page header.\nIt's big.\nVery\nbig.\nHuge."));
        AutoTableElement tableElement(&m_model);
        tableElement.setVerticalHeaderVisible(true);
        tableElement.setPadding(3);
        report.mainTable()->setAutoTableElement(tableElement);
        // report.exportToFile( "testWithHeaders.pdf" ); // for debugging
#ifndef Q_OS_MAC
        QCOMPARE(report.numberOfPages(), 2);
#endif
    }